

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O2

void __thiscall
JetHead::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
sizeup(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,uint newSize)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long lVar2;
  uint i;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0x20;
  if (this->mAllocated != 0) {
    uVar4 = (ulong)(this->mAllocated * 2);
  }
  if (newSize != 0) {
    uVar4 = (ulong)newSize;
  }
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           operator_new__(uVar4 << 5);
  if (this->mData != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    lVar2 = 0;
    for (uVar3 = 0; uVar3 < this->mSize; uVar3 = uVar3 + 1) {
      std::__cxx11::string::string
                ((string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar2),
                 (string *)((long)&(this->mData->_M_dataplus)._M_p + lVar2));
      std::__cxx11::string::~string((string *)((long)&(this->mData->_M_dataplus)._M_p + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    if (this->mData != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete__(this->mData);
    }
  }
  this->mData = pbVar1;
  this->mAllocated = (uint)uVar4;
  return;
}

Assistant:

void sizeup(unsigned newSize=0)
		{
			// No size was specified, double the existing size.
			// Doubling a self-expanding array means that storing O(n) 
			// elements takes O(n lg n) worst case.  Adding only a 
			// constant number of elements makes that O(n^2).
			if (newSize == 0) 
			{
				// If we allocated ANYTHING yet, then double it, if 
				// not just use the default size.
				if (mAllocated)
				{
					newSize = mAllocated * 2;
				} else {
					newSize = DEFAULT_ALLOCATION;
				}
			}

			// A new buffer
			T* temp = (T*)(new uint8_t[sizeof(T) * newSize]);

			// If we had data, copy it over
			if (mData)
			{
				// Move all of my data into the new buffer (copy then delete)
				for (unsigned i = 0; i < mSize; i++)
				{
					new(temp + i) T(mData[i]);
					mData[i].~T();
				}
				
				// Delete old buffer
				delete[] (uint8_t*)mData;
			}
			
			// Keep new buffer
			mData = temp;

			// Remember new allocation size
			mAllocated = newSize;
		}